

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

char * linenoise(char *prompt)

{
  ushort *puVar1;
  linenoiseCompletionCallback *plVar2;
  undefined8 uVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  ssize_t sVar9;
  char *pcVar10;
  ulong uVar11;
  int *piVar12;
  ulong uVar13;
  char *__s;
  int iVar14;
  char *__maxlen;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auStack_1070 [8];
  char local_1068 [8];
  char buf [4096];
  winsize ws;
  undefined1 auStack_58 [8];
  linenoiseCompletions lc;
  char local_35;
  byte local_34;
  char local_33;
  char local_32;
  byte local_31 [7];
  char c;
  
  auStack_1070 = (undefined1  [8])0x1094fe;
  pcVar7 = getenv("TERM");
  if (pcVar7 != (char *)0x0) {
    lVar17 = 0;
    do {
      if (lVar17 == 0x18) goto LAB_001095b4;
      auStack_1070 = (undefined1  [8])0x10952a;
      iVar5 = strcasecmp(pcVar7,*(char **)((long)unsupported_term + lVar17));
      lVar17 = lVar17 + 8;
    } while (iVar5 != 0);
    auStack_1070 = (undefined1  [8])0x109545;
    printf("%s",prompt);
    auStack_1070 = (undefined1  [8])0x109554;
    fflush(_stdout);
    auStack_1070 = (undefined1  [8])0x10956f;
    pcVar7 = fgets(local_1068,0x1000,_stdin);
    if (pcVar7 == (char *)0x0) {
      return (char *)0x0;
    }
    auStack_1070 = (undefined1  [8])0x109584;
    sVar8 = strlen(local_1068);
    while ((sVar8 != 0 && ((local_1068[sVar8 - 1] == '\r' || (local_1068[sVar8 - 1] == '\n'))))) {
      local_1068[sVar8 - 1] = '\0';
      sVar8 = sVar8 - 1;
    }
    goto LAB_00109d76;
  }
LAB_001095b4:
  auStack_1070 = (undefined1  [8])0x1095bb;
  iVar5 = isatty(0);
  if (iVar5 == 0) {
    auStack_1070 = (undefined1  [8])0x1096f2;
    pcVar7 = fgets(local_1068,0x1000,_stdin);
    if (pcVar7 == (char *)0x0) {
      return (char *)0x0;
    }
    auStack_1070 = (undefined1  [8])0x109707;
    sVar8 = strlen(local_1068);
    iVar5 = (int)sVar8;
    if (iVar5 == 0) goto LAB_00109d76;
    if (local_1068[iVar5 + -1] == '\n') {
      local_1068[iVar5 + -1] = '\0';
      goto LAB_00109d76;
    }
  }
  else {
    auStack_1070 = (undefined1  [8])0x1095cc;
    iVar5 = linenoiseEnableRawMode(0);
    if (iVar5 == -1) {
      return (char *)0x0;
    }
    ls.ifd = 0;
    ls.ofd = 1;
    ls.buf = local_1068;
    ls.buflen = 0x1000;
    auStack_1070 = (undefined1  [8])0x10960e;
    ls.prompt = prompt;
    ls.plen = strlen(prompt);
    ls.pos = 0;
    ls.oldpos = 0;
    ls.len = 0;
    iVar14 = 0x5413;
    iVar15 = 1;
    auStack_1070 = (undefined1  [8])0x109641;
    iVar5 = ioctl(1,0x5413,buf + 0xff8);
    if (buf._4090_2_ == 0 || iVar5 == -1) {
      auStack_1070 = (undefined1  [8])0x109661;
      iVar5 = getCursorPosition(iVar15,iVar14);
      uVar16 = 0x50;
      if (iVar5 != -1) {
        iVar14 = 0x10dc7a;
        auStack_1070 = (undefined1  [8])0x109683;
        iVar15 = 1;
        sVar9 = write(1,"\x1b[999C",6);
        if (sVar9 == 6) {
          auStack_1070 = (undefined1  [8])0x109692;
          uVar6 = getCursorPosition(iVar15,iVar14);
          if ((uVar6 != 0xffffffff) && (uVar16 = uVar6, iVar5 < (int)uVar6)) {
            auStack_1070 = (undefined1  [8])0x1096bc;
            snprintf(auStack_58,0x20,"\x1b[%dD");
            auStack_1070 = (undefined1  [8])0x1096c4;
            sVar8 = strlen(auStack_58);
            auStack_1070 = (undefined1  [8])0x1096d2;
            write(1,auStack_58,sVar8);
          }
        }
      }
    }
    else {
      uVar16 = (uint)(ushort)buf._4090_2_;
    }
    ls.cols = (size_t)(int)uVar16;
    ls.maxrows = 0;
    ls.history_index = 0;
    *ls.buf = '\0';
    ls.buflen = ls.buflen - 1;
    auStack_1070 = (undefined1  [8])0x10976d;
    linenoiseHistoryAdd("");
    auStack_1070 = (undefined1  [8])0x109782;
    sVar9 = write(ls.ofd,prompt,ls.plen);
    if (sVar9 != -1) {
switchD_00109c8a_caseD_45:
      uVar13 = 1;
      auStack_1070 = (undefined1  [8])0x1097a1;
      sVar9 = read(ls.ifd,local_31,1);
      plVar2 = completionCallback;
      pcVar7 = ls.buf;
      if ((int)sVar9 < 1) {
LAB_00109cef:
        iVar5 = (int)ls.len;
        goto LAB_00109d62;
      }
      uVar16 = (uint)local_31[0];
      if (completionCallback != (linenoiseCompletionCallback *)0x0 && local_31[0] == 9) {
        lc.len = 0;
        auStack_58 = (undefined1  [8])0x0;
        lc.path = 0;
        lc._4_4_ = 0;
        local_32 = '\0';
        auStack_1070 = (undefined1  [8])0x1097ee;
        pcVar10 = strrchr(ls.buf,0x20);
        __s = pcVar10 + 1;
        if (pcVar10 == (char *)0x0) {
          __s = pcVar7;
        }
        auStack_1070 = (undefined1  [8])0x109806;
        (*plVar2)(pcVar7,__s,(linenoiseCompletions *)auStack_58);
        sVar4 = lc.len;
        uVar3 = lc._0_8_;
        if (lc._0_8_ == 0) {
          auStack_1070 = (undefined1  [8])0x10988d;
          fputc(7,_stderr);
          auStack_1070 = (undefined1  [8])0x109895;
          fflush(_stderr);
          uVar16 = 0;
LAB_00109a93:
          auStack_1070 = (undefined1  [8])0x109a9c;
          freeCompletions((linenoiseCompletions *)auStack_58);
          if ((int)uVar16 < 0) goto LAB_00109cef;
        }
        else {
          auStack_1070 = (undefined1  [8])0x10981f;
          pcVar7 = strdup(*(char **)lc.len);
          for (; uVar13 < (ulong)uVar3; uVar13 = (ulong)((int)uVar13 + 1)) {
            pcVar10 = *(char **)(sVar4 + uVar13 * 8);
            auStack_1070 = (undefined1  [8])0x109836;
            sVar8 = strlen(pcVar10);
            uVar11 = 0;
            do {
              uVar18 = uVar11;
              if (sVar8 <= uVar18) break;
              uVar11 = (ulong)((int)uVar18 + 1);
            } while (pcVar10[uVar18] == pcVar7[uVar18]);
            pcVar7[uVar18] = '\0';
          }
          if (auStack_58._0_4_ != 0) {
            auStack_1070 = (undefined1  [8])0x10986a;
            pcVar10 = strrchr(__s,0x2f);
            if (pcVar10 != (char *)0x0) {
              __s = pcVar10 + 1;
            }
          }
          if (uVar3 == 1) {
            auStack_1070 = (undefined1  [8])0x1098b3;
            sVar8 = strlen(pcVar7);
            if (pcVar7[sVar8 - 1] == '/') goto LAB_001098bb;
            __maxlen = ls.buf + (ls.buflen - (long)__s);
            pcVar10 = "%s ";
          }
          else {
LAB_001098bb:
            __maxlen = ls.buf + (ls.buflen - (long)__s);
            pcVar10 = "%s";
          }
          auStack_1070 = (undefined1  [8])0x1098fd;
          iVar5 = snprintf(__s,(size_t)__maxlen,pcVar10,pcVar7);
          auStack_1070 = (undefined1  [8])0x109908;
          free(pcVar7);
          ls.pos = (size_t)(__s + ((long)iVar5 - (long)ls.buf));
          auStack_1070 = (undefined1  [8])0x109928;
          ls.len = ls.pos;
          linenoiseRefreshLine();
          uVar16 = 0;
          if (lc._0_8_ != 1) {
            auStack_1070 = (undefined1  [8])0x10995a;
            sVar9 = read(ls.ifd,&local_32,1);
            if ((int)sVar9 < 1) {
LAB_00109ce6:
              auStack_1070 = (undefined1  [8])0x109cef;
              freeCompletions((linenoiseCompletions *)auStack_58);
              goto LAB_00109cef;
            }
            uVar16 = (uint)local_32;
            if (uVar16 == 9) {
              auStack_1070 = (undefined1  [8])0x109987;
              ioctl(ls.ifd,0x5413,buf + 0xff8);
              sVar4 = lc.len;
              auStack_1070 = (undefined1  [8])0x109993;
              sVar8 = strlen(*(char **)lc.len);
              uVar3 = lc._0_8_;
              for (uVar13 = 1; uVar13 < (ulong)uVar3; uVar13 = (ulong)((int)uVar13 + 1)) {
                auStack_1070 = (undefined1  [8])0x1099ae;
                uVar11 = strlen(*(char **)(sVar4 + uVar13 * 8));
                if (uVar11 <= (sVar8 & 0xffffffff)) {
                  uVar11 = sVar8;
                }
                sVar8 = uVar11 & 0xffffffff;
              }
              iVar5 = -2;
              uVar13 = 0xffffffff;
              do {
                iVar5 = iVar5 + (int)sVar8 + 2;
                uVar6 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar6;
              } while (iVar5 <= (int)(uint)(ushort)buf._4090_2_);
              uVar16 = 9;
              if (uVar6 == 0) goto LAB_00109932;
              while (uVar16 = (uint)local_32, uVar16 == 9) {
                auStack_1070 = (undefined1  [8])0x109a01;
                linenoiseDisableRawMode(ls.ifd);
                auStack_1070 = (undefined1  [8])0x109a09;
                putchar(10);
                uVar11 = 1;
                while( true ) {
                  uVar18 = (ulong)((int)uVar11 - 1);
                  if ((ulong)lc._0_8_ <= uVar18) break;
                  auStack_1070 = (undefined1  [8])0x109a2f;
                  printf("%-*s",sVar8 & 0xffffffff,*(undefined8 *)(lc.len + uVar18 * 8));
                  if (((int)(uVar11 % uVar13) == 0) || (lc._0_8_ - 1 == uVar18)) {
                    auStack_1070 = (undefined1  [8])0x109a4f;
                    putchar(10);
                  }
                  else {
                    auStack_1070 = (undefined1  [8])0x109a5f;
                    printf("  ");
                  }
                  uVar11 = (ulong)((int)uVar11 + 1);
                }
                auStack_1070 = (undefined1  [8])0x109a6f;
                linenoiseEnableRawMode(ls.ifd);
                auStack_1070 = (undefined1  [8])0x109a74;
                linenoiseRefreshLine();
                auStack_1070 = (undefined1  [8])0x109a86;
                sVar9 = read(ls.ifd,&local_32,1);
                if ((int)sVar9 < 1) goto LAB_00109ce6;
              }
            }
            goto LAB_00109a93;
          }
LAB_00109932:
          auStack_1070 = (undefined1  [8])0x10993b;
          freeCompletions((linenoiseCompletions *)auStack_58);
          local_31[0] = (byte)uVar16;
        }
        if (uVar16 == 0) goto switchD_00109c8a_caseD_45;
      }
      switch(uVar16 & 0xff) {
      case 1:
        goto switchD_00109acc_caseD_1;
      case 2:
switchD_00109acc_caseD_2:
        auStack_1070 = (undefined1  [8])0x109cbd;
        linenoiseEditMoveLeft(&ls);
        goto switchD_00109c8a_caseD_45;
      case 3:
        auStack_1070 = (undefined1  [8])0x109cfc;
        piVar12 = __errno_location();
        *piVar12 = 0xb;
        goto LAB_00109d5f;
      case 4:
        if (ls.len == 0) {
          lVar17 = (long)history_len;
          history_len = history_len + -1;
          auStack_1070 = (undefined1  [8])0x109d5f;
          free(history[lVar17 + -1]);
          goto LAB_00109d5f;
        }
LAB_00109bd2:
        auStack_1070 = (undefined1  [8])0x109bde;
        linenoiseEditDelete(&ls);
        goto switchD_00109c8a_caseD_45;
      case 5:
switchD_00109acc_caseD_5:
        auStack_1070 = (undefined1  [8])0x109cac;
        linenoiseEditMoveEnd(&ls);
        goto switchD_00109c8a_caseD_45;
      case 6:
switchD_00109acc_caseD_6:
        auStack_1070 = (undefined1  [8])0x109cce;
        linenoiseEditMoveRight(&ls);
        goto switchD_00109c8a_caseD_45;
      case 7:
      case 9:
      case 10:
      case 0xf:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
        goto switchD_00109acc_caseD_7;
      case 8:
switchD_00109acc_caseD_8:
        auStack_1070 = (undefined1  [8])0x109af0;
        linenoiseEditBackspace(&ls);
        goto switchD_00109c8a_caseD_45;
      case 0xb:
        local_1068[ls.pos] = '\0';
        ls.len = ls.pos;
        break;
      case 0xc:
        auStack_1070 = (undefined1  [8])0x109bc2;
        linenoiseClearScreen();
        break;
      case 0xd:
        lVar17 = (long)history_len;
        history_len = history_len + -1;
        auStack_1070 = (undefined1  [8])0x109d26;
        free(history[lVar17 + -1]);
        if (mlmode != 0) {
          auStack_1070 = (undefined1  [8])0x109d3b;
          linenoiseEditMoveEnd(&ls);
        }
        goto LAB_00109cef;
      case 0xe:
switchD_00109acc_caseD_e:
        auStack_1070 = (undefined1  [8])0x109ce1;
        linenoiseEditHistoryNext(&ls,0);
        goto switchD_00109c8a_caseD_45;
      case 0x10:
switchD_00109acc_caseD_10:
        auStack_1070 = (undefined1  [8])0x109c9b;
        linenoiseEditHistoryNext(&ls,1);
        goto switchD_00109c8a_caseD_45;
      case 0x14:
        if (ls.len <= ls.pos || ls.pos == 0) goto switchD_00109c8a_caseD_45;
        puVar1 = (ushort *)(local_1068 + (ls.pos - 1));
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        if (ls.pos != ls.len - 1) {
          ls.pos = ls.pos + 1;
        }
        break;
      case 0x15:
        ls.len = 0;
        local_1068[0] = '\0';
        ls.pos = 0;
        break;
      case 0x17:
        auStack_1070 = (undefined1  [8])0x109c54;
        linenoiseEditDeletePrevWord(&ls);
        goto switchD_00109c8a_caseD_45;
      case 0x1b:
        auStack_1070 = (undefined1  [8])0x109b40;
        sVar9 = read(ls.ifd,&local_35,1);
        if (sVar9 != -1) {
          auStack_1070 = (undefined1  [8])0x109b5c;
          sVar9 = read(ls.ifd,&local_34,1);
          if (sVar9 != -1) {
            if (local_35 == 'O') {
              if (local_34 == 0x46) goto switchD_00109acc_caseD_5;
              if (local_34 == 0x48) {
switchD_00109acc_caseD_1:
                auStack_1070 = (undefined1  [8])0x109ada;
                linenoiseEditMoveHome(&ls);
              }
            }
            else if (local_35 == '[') {
              if (9 < (byte)(local_34 - 0x30)) {
                switch(local_34) {
                case 0x41:
                  goto switchD_00109acc_caseD_10;
                case 0x42:
                  goto switchD_00109acc_caseD_e;
                case 0x43:
                  goto switchD_00109acc_caseD_6;
                case 0x44:
                  goto switchD_00109acc_caseD_2;
                default:
                  goto switchD_00109c8a_caseD_45;
                case 0x46:
                  goto switchD_00109acc_caseD_5;
                case 0x48:
                  goto switchD_00109acc_caseD_1;
                }
              }
              auStack_1070 = (undefined1  [8])0x109b9e;
              sVar9 = read(ls.ifd,&local_33,1);
              if (((sVar9 != -1) && (local_33 == '~')) && (local_34 == 0x33)) goto LAB_00109bd2;
            }
          }
        }
        goto switchD_00109c8a_caseD_45;
      default:
        if ((uVar16 & 0xff) == 0x7f) goto switchD_00109acc_caseD_8;
switchD_00109acc_caseD_7:
        auStack_1070 = (undefined1  [8])0x109b05;
        iVar5 = linenoiseEditInsert(&ls,(char)uVar16);
        if (iVar5 != 0) goto LAB_00109d5f;
        goto switchD_00109c8a_caseD_45;
      }
      auStack_1070 = (undefined1  [8])0x109bfe;
      linenoiseRefreshLine();
      goto switchD_00109c8a_caseD_45;
    }
LAB_00109d5f:
    iVar5 = -1;
LAB_00109d62:
    auStack_1070 = (undefined1  [8])0x109d69;
    linenoiseDisableRawMode(0);
    auStack_1070 = (undefined1  [8])0x109d71;
    putchar(10);
  }
  if (iVar5 == -1) {
    return (char *)0x0;
  }
LAB_00109d76:
  auStack_1070 = (undefined1  [8])0x109d82;
  pcVar7 = strdup(local_1068);
  return pcVar7;
}

Assistant:

char *linenoise(const char *prompt) {
    char buf[LINENOISE_MAX_LINE];
    int count;

    if (isUnsupportedTerm()) {
        size_t len;

        printf("%s",prompt);
        fflush(stdout);
        if (fgets(buf,LINENOISE_MAX_LINE,stdin) == NULL) return NULL;
        len = strlen(buf);
        while(len && (buf[len-1] == '\n' || buf[len-1] == '\r')) {
            len--;
            buf[len] = '\0';
        }
        return strdup(buf);
    } else {
        count = linenoiseRaw(buf,LINENOISE_MAX_LINE,prompt);
        if (count == -1) return NULL;
        return strdup(buf);
    }
}